

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateArenaDestructorCode
          (MessageGenerator *this,Printer *printer)

{
  pointer ppFVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  FieldGenerator *pFVar5;
  long lVar6;
  bool bVar7;
  char *format_00;
  bool bVar8;
  bool bVar9;
  pointer ppFVar10;
  undefined1 local_b8 [8];
  Iterator __end3;
  Formatter format;
  Iterator __end4;
  undefined1 local_58 [8];
  Iterator __begin3;
  Iterator __begin4;
  
  __end3.descriptor = (Descriptor *)printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&format,&(this->variables_)._M_t);
  Formatter::operator()<>
            ((Formatter *)&__end3.descriptor,"void $classname$::ArenaDtor(void* object) {\n");
  google::protobuf::io::Printer::Indent();
  Formatter::operator()<>
            ((Formatter *)&__end3.descriptor,
             "$classname$* _this = reinterpret_cast< $classname$* >(object);\n(void)_this;\n");
  ppFVar10 = (this->optimized_order_).
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppFVar1 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar10 == ppFVar1) {
    bVar8 = false;
    bVar9 = false;
  }
  else {
    bVar3 = false;
    bVar7 = false;
    do {
      pFVar5 = FieldGeneratorMap::get(&this->field_generators_,*ppFVar10);
      iVar4 = (*pFVar5->_vptr_FieldGenerator[0x11])(pFVar5,printer);
      bVar8 = true;
      bVar9 = true;
      if ((char)iVar4 == '\0') {
        bVar8 = bVar3;
        bVar9 = bVar7;
      }
      ppFVar10 = ppFVar10 + 1;
      bVar3 = bVar8;
      bVar7 = bVar9;
    } while (ppFVar10 != ppFVar1);
  }
  __end3._0_8_ = this->descriptor_;
  local_58._0_4_ = 0;
  local_b8._0_4_ = *(undefined4 *)(__end3._0_8_ + 0x70);
  __begin3._0_8_ = __end3._0_8_;
  while (bVar3 = operator==((Iterator *)local_58,(Iterator *)local_b8), !bVar3) {
    lVar6 = (long)(int)local_58._0_4_;
    lVar2 = *(long *)(__begin3._0_8_ + 0x30);
    __begin3.descriptor._0_4_ = 0;
    format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
         *(undefined4 *)(lVar2 + 0x18 + lVar6 * 0x30);
    while (bVar3 = operator==((Iterator *)&__begin3.descriptor,
                              (Iterator *)
                              &format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count),
          !bVar3) {
      pFVar5 = FieldGeneratorMap::get
                         (&this->field_generators_,
                          *(FieldDescriptor **)
                           (*(long *)(lVar2 + lVar6 * 0x30 + 0x20) +
                           (long)(int)__begin3.descriptor * 8));
      iVar4 = (*pFVar5->_vptr_FieldGenerator[0x11])(pFVar5,printer);
      bVar9 = true;
      if ((char)iVar4 == '\0') {
        bVar9 = bVar8;
      }
      __begin3.descriptor._0_4_ = (int)__begin3.descriptor + 1;
      bVar8 = bVar9;
    }
    local_58._0_4_ = local_58._0_4_ + 1;
  }
  if (this->num_weak_fields_ != 0) {
    bVar9 = true;
    Formatter::operator()<>((Formatter *)&__end3.descriptor,"_this->_weak_field_map_.ClearAll();\n")
    ;
  }
  google::protobuf::io::Printer::Outdent();
  Formatter::operator()<>((Formatter *)&__end3.descriptor,"}\n");
  format_00 = "void $classname$::RegisterArenaDtor(::$proto_ns$::Arena*) {\n}\n";
  if (bVar9) {
    format_00 = 
    "inline void $classname$::RegisterArenaDtor(::$proto_ns$::Arena* arena) {\n  if (arena != nullptr) {\n    arena->OwnCustomDestructor(this, &$classname$::ArenaDtor);\n  }\n}\n"
    ;
  }
  Formatter::operator()<>((Formatter *)&__end3.descriptor,format_00);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&format);
  return;
}

Assistant:

void MessageGenerator::GenerateArenaDestructorCode(io::Printer* printer) {
  Formatter format(printer, variables_);

  // Generate the ArenaDtor() method. Track whether any fields actually produced
  // code that needs to be called.
  format("void $classname$::ArenaDtor(void* object) {\n");
  format.Indent();

  // This code is placed inside a static method, rather than an ordinary one,
  // since that simplifies Arena's destructor list (ordinary function pointers
  // rather than member function pointers). _this is the object being
  // destructed.
  format(
      "$classname$* _this = reinterpret_cast< $classname$* >(object);\n"
      // avoid an "unused variable" warning in case no fields have dtor code.
      "(void)_this;\n");

  bool need_registration = false;
  // Process non-oneof fields first.
  for (auto field : optimized_order_) {
    if (field_generators_.get(field).GenerateArenaDestructorCode(printer)) {
      need_registration = true;
    }
  }

  // Process oneof fields.
  //
  // Note:  As of 10/5/2016, GenerateArenaDestructorCode does not emit anything
  // and returns false for oneof fields.
  for (auto oneof : OneOfRange(descriptor_)) {
    for (auto field : FieldRange(oneof)) {
      if (IsFieldUsed(field, options_) &&
          field_generators_.get(field).GenerateArenaDestructorCode(printer)) {
        need_registration = true;
      }
    }
  }
  if (num_weak_fields_) {
    // _this is the object being destructed (we are inside a static method
    // here).
    format("_this->_weak_field_map_.ClearAll();\n");
    need_registration = true;
  }

  format.Outdent();
  format("}\n");

  if (need_registration) {
    format(
        "inline void $classname$::RegisterArenaDtor(::$proto_ns$::Arena* "
        "arena) {\n"
        "  if (arena != nullptr) {\n"
        "    arena->OwnCustomDestructor(this, &$classname$::ArenaDtor);\n"
        "  }\n"
        "}\n");
  } else {
    format(
        "void $classname$::RegisterArenaDtor(::$proto_ns$::Arena*) {\n"
        "}\n");
  }
}